

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Embed(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  Emb_Par_t Pars;
  Emb_Par_t local_5c;
  Abc_Frame_t *local_38;
  
  local_5c.nDims = 0x1e;
  local_5c.nSols = 2;
  local_5c.nIters = 10;
  local_5c.fRefine = 0;
  local_5c.fCluster = 0;
  local_5c.fDump = 0;
  local_5c.fDumpLarge = 0;
  local_5c.fShowImage = 0;
  local_5c.fVerbose = 0;
  local_38 = pAbc;
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"DIrcdlsvh"), iVar6 = globalUtilOptind, 0x6b < iVar1)
    {
      if (iVar1 < 0x73) {
        piVar3 = &local_5c.fDumpLarge;
        if ((iVar1 != 0x6c) && (piVar3 = &local_5c.fRefine, iVar1 != 0x72)) goto LAB_00280a05;
      }
      else {
        piVar3 = &local_5c.fShowImage;
        if (iVar1 != 0x73) {
          if (iVar1 != 0x76) goto LAB_00280a05;
          piVar3 = &local_5c.fVerbose;
        }
      }
LAB_002809c4:
      *(byte *)piVar3 = (byte)*piVar3 ^ 1;
    }
    if (0x62 < iVar1) {
      piVar3 = &local_5c.fCluster;
      if ((iVar1 == 99) || (piVar3 = &local_5c.fDump, iVar1 == 100)) goto LAB_002809c4;
      break;
    }
    if (iVar1 == 0x44) {
      if (argc <= globalUtilOptind) {
LAB_002809f2:
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        break;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_5c.nDims = uVar2;
    }
    else {
      if (iVar1 != 0x49) {
        if (iVar1 == -1) {
          if (local_38->pGia != (Gia_Man_t *)0x0) {
            Gia_ManSolveProblem(local_38->pGia,&local_5c);
            return 0;
          }
          pcVar4 = "Abc_CommandAbc9Embed(): There is no AIG.\n";
          iVar6 = -1;
          goto LAB_00280b53;
        }
        break;
      }
      if (argc <= globalUtilOptind) goto LAB_002809f2;
      uVar2 = atoi(argv[globalUtilOptind]);
      local_5c.nIters = uVar2;
    }
    globalUtilOptind = iVar6 + 1;
  } while (-1 < (int)uVar2);
LAB_00280a05:
  Abc_Print(-2,"usage: &embed [-DI <num>] [-rdlscvh]\n");
  Abc_Print(-2,"\t         fast placement based on high-dimensional embedding from\n");
  Abc_Print(-2,"\t         D. Harel and Y. Koren, \"Graph drawing by high-dimensional\n");
  Abc_Print(-2,"\t         embedding\", J. Graph Algs & Apps, 2004, Vol 8(2), pp. 195-217\n");
  Abc_Print(-2,"\t-D num : the number of dimensions for embedding [default = %d]\n",
            local_5c._0_8_ & 0xffffffff);
  Abc_Print(-2,"\t-I num : the number of refinement iterations [default = %d]\n",
            (ulong)(uint)local_5c.nIters);
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (local_5c.fRefine == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-r     : toggle the use of refinement [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (local_5c.fCluster == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-c     : toggle clustered representation [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (local_5c.fDump == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle dumping placement into a Gnuplot file [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (local_5c.fDumpLarge == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-l     : toggle dumping Gnuplot for large placement [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (local_5c.fShowImage == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-s     : toggle showing image if Gnuplot is installed [default = %s]\n",pcVar4);
  if (local_5c.fVerbose == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar5);
  pcVar4 = "\t-h     : print the command usage\n";
  iVar6 = -2;
LAB_00280b53:
  Abc_Print(iVar6,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandAbc9Embed( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Emb_Par_t Pars, * pPars = &Pars;
    int c;
    pPars->nDims      = 30;
    pPars->nIters     = 10;
    pPars->nSols      =  2;
    pPars->fRefine    =  0;
    pPars->fCluster   =  0;
    pPars->fDump      =  0;
    pPars->fDumpLarge =  0;
    pPars->fShowImage =  0;
    pPars->fVerbose   =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "DIrcdlsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nDims = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDims < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIters < 0 )
                goto usage;
            break;
        case 'r':
            pPars->fRefine ^= 1;
            break;
        case 'c':
            pPars->fCluster ^= 1;
            break;
        case 'd':
            pPars->fDump ^= 1;
            break;
        case 'l':
            pPars->fDumpLarge ^= 1;
            break;
        case 's':
            pPars->fShowImage ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Embed(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManSolveProblem( pAbc->pGia, pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: &embed [-DI <num>] [-rdlscvh]\n" );
    Abc_Print( -2, "\t         fast placement based on high-dimensional embedding from\n" );
    Abc_Print( -2, "\t         D. Harel and Y. Koren, \"Graph drawing by high-dimensional\n" );
    Abc_Print( -2, "\t         embedding\", J. Graph Algs & Apps, 2004, Vol 8(2), pp. 195-217\n" );
    Abc_Print( -2, "\t-D num : the number of dimensions for embedding [default = %d]\n", pPars->nDims );
    Abc_Print( -2, "\t-I num : the number of refinement iterations [default = %d]\n", pPars->nIters );
    Abc_Print( -2, "\t-r     : toggle the use of refinement [default = %s]\n", pPars->fRefine? "yes":"no");
    Abc_Print( -2, "\t-c     : toggle clustered representation [default = %s]\n", pPars->fCluster? "yes":"no");
    Abc_Print( -2, "\t-d     : toggle dumping placement into a Gnuplot file [default = %s]\n", pPars->fDump? "yes":"no");
    Abc_Print( -2, "\t-l     : toggle dumping Gnuplot for large placement [default = %s]\n", pPars->fDumpLarge? "yes":"no");
    Abc_Print( -2, "\t-s     : toggle showing image if Gnuplot is installed [default = %s]\n", pPars->fShowImage? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}